

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sds.cpp
# Opt level: O2

void duckdb_hll::sdsrange(sds s,ssize_t start,ssize_t end)

{
  size_t sVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  size_t __n;
  
  sVar1 = sdslen(s);
  if (sVar1 != 0) {
    __n = 0;
    uVar4 = sVar1 + start;
    if ((long)(sVar1 + start) < 1) {
      uVar4 = __n;
    }
    if (-1 < start) {
      uVar4 = start;
    }
    uVar2 = sVar1 + end;
    if ((long)(sVar1 + end) < 1) {
      uVar2 = __n;
    }
    if (-1 < end) {
      uVar2 = end;
    }
    uVar3 = (uVar2 - uVar4) + 1;
    if (uVar2 < uVar4) {
      uVar3 = __n;
    }
    if ((sVar1 - uVar4 != 0 && (long)uVar4 <= (long)sVar1) && (uVar3 != 0)) {
      __n = sVar1 - uVar4;
      if (sVar1 - 1 < uVar4) {
        __n = 0;
      }
      if (uVar2 < sVar1) {
        __n = uVar3;
      }
      if ((uVar4 != 0) && (__n != 0)) {
        memmove(s,s + uVar4,__n);
      }
    }
    s[__n] = '\0';
    sdssetlen(s,__n);
    return;
  }
  return;
}

Assistant:

void sdsrange(sds s, ssize_t start, ssize_t end) {
    size_t newlen, len = sdslen(s);

    if (len == 0) return;
    if (start < 0) {
        start = len+start;
        if (start < 0) start = 0;
    }
    if (end < 0) {
        end = len+end;
        if (end < 0) end = 0;
    }
    newlen = (start > end) ? 0 : (end-start)+1;
    if (newlen != 0) {
        if (start >= (ssize_t)len) {
            newlen = 0;
        } else if (end >= (ssize_t)len) {
            end = len-1;
            newlen = (start > end) ? 0 : (end-start)+1;
        }
    } else {
        start = 0;
    }
    if (start && newlen) memmove(s, s+start, newlen);
    s[newlen] = 0;
    sdssetlen(s,newlen);
}